

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary-ops.cpp
# Opt level: O3

void ggml_compute_forward_hardswish(ggml_compute_params *params,ggml_tensor *dst)

{
  uint *puVar1;
  ggml_type gVar2;
  ggml_type gVar3;
  int iVar4;
  int iVar5;
  ggml_tensor *pgVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  long lVar10;
  long lVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  void *pvVar15;
  void *pvVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  byte bVar30;
  byte bVar31;
  char cVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  ulong uVar37;
  char *pcVar38;
  long lVar39;
  int64_t nth;
  ushort uVar40;
  float fVar41;
  undefined8 uVar42;
  int64_t ir;
  long lVar43;
  long lVar44;
  int64_t nth_1;
  undefined1 auVar46 [32];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  anon_union_4_2_947300a4 u;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar45 [32];
  
  pgVar6 = dst->src[0];
  gVar2 = dst->type;
  gVar3 = pgVar6->type;
  if (gVar3 == GGML_TYPE_BF16) {
    if (gVar2 == GGML_TYPE_F32) {
      cVar32 = ggml_is_contiguous_1(pgVar6);
      if (((cVar32 != '\0') && (cVar32 = ggml_is_contiguous_1(dst), cVar32 != '\0')) &&
         (cVar32 = ggml_are_same_shape(pgVar6,dst), cVar32 != '\0')) {
        if (dst->nb[0] == 4) {
          if (pgVar6->nb[0] == 2) {
            sVar7 = pgVar6->nb[2];
            sVar8 = pgVar6->nb[3];
            sVar9 = pgVar6->nb[1];
            lVar10 = pgVar6->ne[1];
            lVar44 = pgVar6->ne[2];
            lVar11 = dst->ne[0];
            sVar12 = dst->nb[1];
            sVar13 = dst->nb[2];
            sVar14 = dst->nb[3];
            iVar4 = params->ith;
            iVar5 = params->nth;
            lVar33 = ggml_nrows(pgVar6);
            lVar34 = ((long)iVar5 + -1 + lVar33) / (long)iVar5;
            lVar43 = iVar4 * lVar34;
            lVar34 = lVar34 + lVar43;
            if (lVar33 <= lVar34) {
              lVar34 = lVar33;
            }
            if (lVar43 < lVar34) {
              auVar47 = vbroadcastss_avx512f(ZEXT416(0x40400000));
              auVar48 = vbroadcastss_avx512f(ZEXT416(0x40c00000));
              auVar49 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
              auVar50 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
              auVar51 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
              pvVar15 = pgVar6->data;
              lVar44 = lVar44 * lVar10;
              pvVar16 = dst->data;
              auVar52 = vpbroadcastq_avx512f();
              do {
                lVar33 = lVar43 / lVar44;
                lVar39 = lVar43 % lVar44;
                lVar35 = lVar39 / lVar10;
                lVar39 = lVar39 % lVar10;
                if (0 < lVar11) {
                  uVar37 = 0;
                  do {
                    auVar53 = vpbroadcastq_avx512f();
                    auVar54 = vporq_avx512f(auVar53,auVar50);
                    auVar53 = vporq_avx512f(auVar53,auVar51);
                    uVar42 = vpcmpuq_avx512f(auVar53,auVar52,2);
                    bVar30 = (byte)uVar42;
                    uVar42 = vpcmpuq_avx512f(auVar54,auVar52,2);
                    bVar31 = (byte)uVar42;
                    uVar40 = CONCAT11(bVar31,bVar30);
                    auVar45 = vmovdqu16_avx512vl(*(undefined1 (*) [32])
                                                  ((long)pvVar15 +
                                                  uVar37 * 2 +
                                                  lVar35 * sVar7 + lVar39 * sVar9 + lVar33 * sVar8))
                    ;
                    auVar46._2_2_ = (ushort)((byte)(uVar40 >> 1) & 1) * auVar45._2_2_;
                    auVar46._0_2_ = (ushort)(bVar30 & 1) * auVar45._0_2_;
                    auVar46._4_2_ = (ushort)((byte)(uVar40 >> 2) & 1) * auVar45._4_2_;
                    auVar46._6_2_ = (ushort)((byte)(uVar40 >> 3) & 1) * auVar45._6_2_;
                    auVar46._8_2_ = (ushort)((byte)(uVar40 >> 4) & 1) * auVar45._8_2_;
                    auVar46._10_2_ = (ushort)((byte)(uVar40 >> 5) & 1) * auVar45._10_2_;
                    auVar46._12_2_ = (ushort)((byte)(uVar40 >> 6) & 1) * auVar45._12_2_;
                    auVar46._14_2_ = (ushort)((byte)(uVar40 >> 7) & 1) * auVar45._14_2_;
                    auVar46._16_2_ = (ushort)(bVar31 & 1) * auVar45._16_2_;
                    auVar46._18_2_ = (ushort)(bVar31 >> 1 & 1) * auVar45._18_2_;
                    auVar46._20_2_ = (ushort)(bVar31 >> 2 & 1) * auVar45._20_2_;
                    auVar46._22_2_ = (ushort)(bVar31 >> 3 & 1) * auVar45._22_2_;
                    auVar46._24_2_ = (ushort)(bVar31 >> 4 & 1) * auVar45._24_2_;
                    auVar46._26_2_ = (ushort)(bVar31 >> 5 & 1) * auVar45._26_2_;
                    auVar46._28_2_ = (ushort)(bVar31 >> 6 & 1) * auVar45._28_2_;
                    auVar46._30_2_ = (ushort)(bVar31 >> 7) * auVar45._30_2_;
                    auVar53 = vpmovzxwd_avx512f(auVar46);
                    auVar53 = vpslld_avx512f(auVar53,0x10);
                    auVar54 = vaddps_avx512f(auVar53,auVar47);
                    auVar54 = vdivps_avx512f(auVar54,auVar48);
                    auVar54 = vmaxps_avx512f(auVar54,ZEXT1664(ZEXT816(0) << 0x40));
                    auVar54 = vminps_avx512f(auVar54,auVar49);
                    auVar53 = vmulps_avx512f(auVar54,auVar53);
                    puVar1 = (uint *)((long)pvVar16 +
                                     uVar37 * 4 +
                                     lVar35 * sVar13 + lVar39 * sVar12 + lVar33 * sVar14);
                    bVar17 = (bool)((byte)(uVar40 >> 1) & 1);
                    bVar18 = (bool)((byte)(uVar40 >> 2) & 1);
                    bVar19 = (bool)((byte)(uVar40 >> 3) & 1);
                    bVar20 = (bool)((byte)(uVar40 >> 4) & 1);
                    bVar21 = (bool)((byte)(uVar40 >> 5) & 1);
                    bVar22 = (bool)((byte)(uVar40 >> 6) & 1);
                    bVar23 = (bool)((byte)(uVar40 >> 7) & 1);
                    bVar24 = (bool)(bVar31 >> 1 & 1);
                    bVar25 = (bool)(bVar31 >> 2 & 1);
                    bVar26 = (bool)(bVar31 >> 3 & 1);
                    bVar27 = (bool)(bVar31 >> 4 & 1);
                    bVar28 = (bool)(bVar31 >> 5 & 1);
                    bVar29 = (bool)(bVar31 >> 6 & 1);
                    *puVar1 = (uint)(bVar30 & 1) * auVar53._0_4_ |
                              (uint)!(bool)(bVar30 & 1) * *puVar1;
                    puVar1[1] = (uint)bVar17 * auVar53._4_4_ | (uint)!bVar17 * puVar1[1];
                    puVar1[2] = (uint)bVar18 * auVar53._8_4_ | (uint)!bVar18 * puVar1[2];
                    puVar1[3] = (uint)bVar19 * auVar53._12_4_ | (uint)!bVar19 * puVar1[3];
                    puVar1[4] = (uint)bVar20 * auVar53._16_4_ | (uint)!bVar20 * puVar1[4];
                    puVar1[5] = (uint)bVar21 * auVar53._20_4_ | (uint)!bVar21 * puVar1[5];
                    puVar1[6] = (uint)bVar22 * auVar53._24_4_ | (uint)!bVar22 * puVar1[6];
                    puVar1[7] = (uint)bVar23 * auVar53._28_4_ | (uint)!bVar23 * puVar1[7];
                    puVar1[8] = (uint)(bVar31 & 1) * auVar53._32_4_ |
                                (uint)!(bool)(bVar31 & 1) * puVar1[8];
                    puVar1[9] = (uint)bVar24 * auVar53._36_4_ | (uint)!bVar24 * puVar1[9];
                    puVar1[10] = (uint)bVar25 * auVar53._40_4_ | (uint)!bVar25 * puVar1[10];
                    puVar1[0xb] = (uint)bVar26 * auVar53._44_4_ | (uint)!bVar26 * puVar1[0xb];
                    puVar1[0xc] = (uint)bVar27 * auVar53._48_4_ | (uint)!bVar27 * puVar1[0xc];
                    puVar1[0xd] = (uint)bVar28 * auVar53._52_4_ | (uint)!bVar28 * puVar1[0xd];
                    puVar1[0xe] = (uint)bVar29 * auVar53._56_4_ | (uint)!bVar29 * puVar1[0xe];
                    puVar1[0xf] = (uint)(bVar31 >> 7) * auVar53._60_4_ |
                                  (uint)!(bool)(bVar31 >> 7) * puVar1[0xf];
                    uVar37 = uVar37 + 0x10;
                  } while ((lVar11 + 0xfU & 0xfffffffffffffff0) != uVar37);
                }
                lVar43 = lVar43 + 1;
              } while (lVar43 != lVar34);
            }
            return;
          }
          goto LAB_0012e97c;
        }
        goto LAB_0012e960;
      }
    }
    else {
      if (gVar2 != GGML_TYPE_BF16) goto LAB_0012e958;
      cVar32 = ggml_is_contiguous_1(pgVar6);
      if (((cVar32 != '\0') && (cVar32 = ggml_is_contiguous_1(dst), cVar32 != '\0')) &&
         (cVar32 = ggml_are_same_shape(pgVar6,dst), cVar32 != '\0')) {
        if (dst->nb[0] != 2) goto LAB_0012e960;
        if (pgVar6->nb[0] == 2) {
          sVar7 = pgVar6->nb[2];
          sVar8 = pgVar6->nb[3];
          sVar9 = pgVar6->nb[1];
          lVar10 = pgVar6->ne[1];
          lVar44 = pgVar6->ne[2];
          lVar11 = dst->ne[0];
          sVar12 = dst->nb[1];
          sVar13 = dst->nb[2];
          sVar14 = dst->nb[3];
          iVar4 = params->ith;
          iVar5 = params->nth;
          lVar33 = ggml_nrows(pgVar6);
          lVar34 = ((long)iVar5 + -1 + lVar33) / (long)iVar5;
          lVar43 = iVar4 * lVar34;
          lVar34 = lVar34 + lVar43;
          if (lVar33 <= lVar34) {
            lVar34 = lVar33;
          }
          if (lVar34 <= lVar43) {
            return;
          }
          pvVar15 = pgVar6->data;
          lVar44 = lVar44 * lVar10;
          pvVar16 = dst->data;
          do {
            lVar33 = lVar43 / lVar44;
            lVar39 = lVar43 % lVar44;
            lVar35 = lVar39 / lVar10;
            lVar39 = lVar39 % lVar10;
            if (0 < lVar11) {
              lVar36 = 0;
              do {
                fVar41 = (float)((uint)*(ushort *)
                                        ((long)pvVar15 +
                                        lVar36 * 2 +
                                        lVar35 * sVar7 + lVar39 * sVar9 + lVar33 * sVar8) << 0x10);
                auVar55._0_4_ = (fVar41 + 3.0) / 6.0;
                auVar55._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar55 = vmaxss_avx(auVar55,ZEXT816(0) << 0x40);
                auVar55 = vminss_avx(auVar55,SUB6416(ZEXT464(0x3f800000),0));
                fVar41 = auVar55._0_4_ * fVar41;
                if ((uint)ABS(fVar41) < 0x7f800001) {
                  uVar40 = (ushort)((int)fVar41 + 0x7fff + ((uint)fVar41 >> 0x10 & 1) >> 0x10);
                }
                else {
                  uVar40 = (ushort)((uint)fVar41 >> 0x10) | 0x40;
                }
                *(ushort *)
                 ((long)pvVar16 + lVar36 * 2 + lVar35 * sVar13 + lVar39 * sVar12 + lVar33 * sVar14)
                     = uVar40;
                lVar36 = lVar36 + 1;
              } while (lVar11 != lVar36);
            }
            lVar43 = lVar43 + 1;
          } while (lVar43 != lVar34);
          return;
        }
        goto LAB_0012e97c;
      }
    }
  }
  else if (gVar3 == GGML_TYPE_F16) {
    if (gVar2 == GGML_TYPE_F32) {
      cVar32 = ggml_is_contiguous_1(pgVar6);
      if (((cVar32 != '\0') && (cVar32 = ggml_is_contiguous_1(dst), cVar32 != '\0')) &&
         (cVar32 = ggml_are_same_shape(pgVar6,dst), cVar32 != '\0')) {
        if (dst->nb[0] != 4) goto LAB_0012e960;
        if (pgVar6->nb[0] == 2) {
          sVar7 = pgVar6->nb[2];
          sVar8 = pgVar6->nb[3];
          sVar9 = pgVar6->nb[1];
          lVar10 = pgVar6->ne[1];
          lVar44 = pgVar6->ne[2];
          lVar11 = dst->ne[0];
          sVar12 = dst->nb[3];
          sVar13 = dst->nb[1];
          sVar14 = dst->nb[2];
          iVar4 = params->ith;
          iVar5 = params->nth;
          lVar33 = ggml_nrows(pgVar6);
          lVar34 = ((long)iVar5 + -1 + lVar33) / (long)iVar5;
          lVar43 = iVar4 * lVar34;
          lVar34 = lVar34 + lVar43;
          if (lVar33 <= lVar34) {
            lVar34 = lVar33;
          }
          if (lVar34 <= lVar43) {
            return;
          }
          lVar44 = lVar44 * lVar10;
          pvVar15 = dst->data;
          pvVar16 = pgVar6->data;
          do {
            lVar33 = lVar43 / lVar44;
            lVar39 = lVar43 % lVar44;
            lVar35 = lVar39 / lVar10;
            lVar39 = lVar39 % lVar10;
            if (0 < lVar11) {
              lVar36 = 0;
              do {
                auVar58._0_4_ =
                     (*(float *)(&ggml_table_f32_f16 +
                                (ulong)*(ushort *)
                                        ((long)pvVar16 +
                                        lVar36 * 2 +
                                        lVar35 * sVar7 + lVar39 * sVar9 + lVar33 * sVar8) * 4) + 3.0
                     ) / 6.0;
                auVar58._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar55 = vmaxss_avx(auVar58,ZEXT816(0) << 0x40);
                auVar55 = vminss_avx(auVar55,SUB6416(ZEXT464(0x3f800000),0));
                *(float *)((long)pvVar15 +
                          lVar36 * 4 + lVar35 * sVar14 + lVar39 * sVar13 + lVar33 * sVar12) =
                     *(float *)(&ggml_table_f32_f16 +
                               (ulong)*(ushort *)
                                       ((long)pvVar16 +
                                       lVar36 * 2 + lVar35 * sVar7 + lVar39 * sVar9 + lVar33 * sVar8
                                       ) * 4) * auVar55._0_4_;
                lVar36 = lVar36 + 1;
              } while (lVar11 != lVar36);
            }
            lVar43 = lVar43 + 1;
          } while (lVar43 != lVar34);
          return;
        }
LAB_0012e97c:
        pcVar38 = "nb00 == sizeof(src0_t)";
        uVar42 = 0x56;
        goto LAB_0012e996;
      }
    }
    else {
      if (gVar2 != GGML_TYPE_F16) goto LAB_0012e958;
      cVar32 = ggml_is_contiguous_1(pgVar6);
      if (((cVar32 != '\0') && (cVar32 = ggml_is_contiguous_1(dst), cVar32 != '\0')) &&
         (cVar32 = ggml_are_same_shape(pgVar6,dst), cVar32 != '\0')) {
        if (dst->nb[0] != 2) goto LAB_0012e960;
        if (pgVar6->nb[0] == 2) {
          sVar7 = pgVar6->nb[2];
          sVar8 = pgVar6->nb[3];
          sVar9 = pgVar6->nb[1];
          lVar10 = pgVar6->ne[1];
          lVar44 = pgVar6->ne[2];
          lVar11 = dst->ne[0];
          iVar4 = params->ith;
          iVar5 = params->nth;
          lVar33 = ggml_nrows(pgVar6);
          lVar34 = ((long)iVar5 + -1 + lVar33) / (long)iVar5;
          lVar43 = iVar4 * lVar34;
          lVar34 = lVar34 + lVar43;
          if (lVar33 <= lVar34) {
            lVar34 = lVar33;
          }
          if (lVar34 <= lVar43) {
            return;
          }
          lVar44 = lVar44 * lVar10;
          do {
            lVar33 = lVar43 % lVar44;
            if (0 < lVar11) {
              lVar35 = 0;
              do {
                auVar57._0_4_ =
                     (*(float *)(&ggml_table_f32_f16 +
                                (ulong)*(ushort *)
                                        ((long)pgVar6->data +
                                        lVar35 * 2 +
                                        (lVar33 / lVar10) * sVar7 +
                                        (lVar33 % lVar10) * sVar9 + (lVar43 / lVar44) * sVar8) * 4)
                     + 3.0) / 6.0;
                auVar57._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar55 = vmaxss_avx(auVar57,ZEXT816(0) << 0x40);
                auVar55 = vminss_avx(auVar55,SUB6416(ZEXT464(0x3f800000),0));
                auVar55 = vcvtps2ph_f16c(ZEXT416((uint)(*(float *)(&ggml_table_f32_f16 +
                                                                  (ulong)*(ushort *)
                                                                          ((long)pgVar6->data +
                                                                          lVar35 * 2 +
                                                                          (lVar33 / lVar10) * sVar7
                                                                          + (lVar33 % lVar10) *
                                                                            sVar9 + (lVar43 / lVar44
                                                                                    ) * sVar8) * 4)
                                                       * auVar55._0_4_)),0);
                vpextrw_avx(auVar55,0);
                lVar35 = lVar35 + 1;
              } while (lVar11 != lVar35);
            }
            lVar43 = lVar43 + 1;
          } while (lVar43 != lVar34);
          return;
        }
        goto LAB_0012e97c;
      }
    }
  }
  else {
    if ((gVar3 != GGML_TYPE_F32) || (gVar2 != GGML_TYPE_F32)) {
LAB_0012e958:
      ggml_compute_forward_hardswish_cold_1();
LAB_0012e960:
      pcVar38 = "nb0 == sizeof(dst_t)";
      uVar42 = 0x55;
      goto LAB_0012e996;
    }
    cVar32 = ggml_is_contiguous_1(pgVar6);
    if (((cVar32 != '\0') && (cVar32 = ggml_is_contiguous_1(dst), cVar32 != '\0')) &&
       (cVar32 = ggml_are_same_shape(pgVar6,dst), cVar32 != '\0')) {
      if (dst->nb[0] != 4) goto LAB_0012e960;
      if (pgVar6->nb[0] == 4) {
        sVar7 = pgVar6->nb[2];
        sVar8 = pgVar6->nb[3];
        sVar9 = pgVar6->nb[1];
        lVar10 = pgVar6->ne[1];
        lVar44 = pgVar6->ne[2];
        lVar11 = dst->ne[0];
        sVar12 = dst->nb[3];
        sVar13 = dst->nb[1];
        sVar14 = dst->nb[2];
        iVar4 = params->ith;
        iVar5 = params->nth;
        lVar33 = ggml_nrows(pgVar6);
        lVar34 = ((long)iVar5 + -1 + lVar33) / (long)iVar5;
        lVar43 = iVar4 * lVar34;
        lVar34 = lVar34 + lVar43;
        if (lVar33 <= lVar34) {
          lVar34 = lVar33;
        }
        if (lVar34 <= lVar43) {
          return;
        }
        lVar44 = lVar44 * lVar10;
        pvVar15 = dst->data;
        pvVar16 = pgVar6->data;
        do {
          lVar33 = lVar43 / lVar44;
          lVar39 = lVar43 % lVar44;
          lVar35 = lVar39 / lVar10;
          lVar39 = lVar39 % lVar10;
          if (0 < lVar11) {
            lVar36 = 0;
            do {
              fVar41 = *(float *)((long)pvVar16 +
                                 lVar36 * 4 + lVar35 * sVar7 + lVar39 * sVar9 + lVar33 * sVar8);
              auVar56._0_4_ = (fVar41 + 3.0) / 6.0;
              auVar56._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar55 = vmaxss_avx(auVar56,ZEXT816(0) << 0x40);
              auVar55 = vminss_avx(auVar55,SUB6416(ZEXT464(0x3f800000),0));
              *(float *)((long)pvVar15 +
                        lVar36 * 4 + lVar35 * sVar14 + lVar39 * sVar13 + lVar33 * sVar12) =
                   fVar41 * auVar55._0_4_;
              lVar36 = lVar36 + 1;
            } while (lVar11 != lVar36);
          }
          lVar43 = lVar43 + 1;
        } while (lVar43 != lVar34);
        return;
      }
      goto LAB_0012e97c;
    }
  }
  pcVar38 = 
  "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)";
  uVar42 = 0x51;
LAB_0012e996:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/unary-ops.cpp"
             ,uVar42,"GGML_ASSERT(%s) failed",pcVar38);
}

Assistant:

void ggml_compute_forward_hardswish(const ggml_compute_params * params, ggml_tensor * dst) {
    unary_op<op_hardswish>(params, dst);
}